

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

cl_int parseILString(char *originalStr,cl_name_version_khr *ptr,size_t param_value_size,
                    size_t *param_value_size_ret)

{
  int iVar1;
  long *in_RCX;
  ulong in_RDX;
  uint *in_RSI;
  char *in_RDI;
  bool bVar2;
  cl_uint patch;
  cl_uint minor;
  cl_uint major;
  size_t nameSize_1;
  size_t nameSize;
  int numTokens;
  char *str;
  cl_int errorCode;
  uint local_5c;
  uint local_58;
  int local_54;
  ulong local_50;
  bool local_41;
  ulong local_40;
  int local_34;
  char *local_30;
  cl_int local_24;
  long *local_20;
  ulong local_18;
  uint *local_10;
  char *local_8;
  
  local_24 = 0;
  local_34 = 0;
  local_30 = in_RDI;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  while( true ) {
    bVar2 = false;
    if (local_30 != (char *)0x0) {
      bVar2 = *local_30 != '\0';
    }
    if (!bVar2) break;
    while (iVar1 = isspace((int)*local_30), iVar1 != 0) {
      local_30 = local_30 + 1;
    }
    if (*local_30 != '\0') {
      local_40 = 0;
      while( true ) {
        bVar2 = false;
        if (*local_30 != '\0') {
          iVar1 = isspace((int)*local_30);
          bVar2 = iVar1 == 0;
        }
        if (!bVar2) break;
        local_30 = local_30 + 1;
        local_40 = local_40 + 1;
      }
      local_41 = local_40 < 0x40;
      std::_Swallow_assign::operator=((_Swallow_assign *)&std::ignore,&local_41);
      local_34 = local_34 + 1;
    }
  }
  if (local_10 != (uint *)0x0) {
    if (local_18 < (ulong)((long)local_34 * 0x44)) {
      local_24 = -0x1e;
    }
    else {
      local_30 = local_8;
      while( true ) {
        bVar2 = false;
        if (local_30 != (char *)0x0) {
          bVar2 = *local_30 != '\0';
        }
        if (!bVar2) break;
        while (iVar1 = isspace((int)*local_30), iVar1 != 0) {
          local_30 = local_30 + 1;
        }
        if (*local_30 != '\0') {
          memset(local_10 + 1,0,0x40);
          local_50 = 0;
          while( true ) {
            bVar2 = false;
            if ((*local_30 != '\0') && (bVar2 = false, *local_30 != '_')) {
              iVar1 = isspace((int)*local_30);
              bVar2 = iVar1 == 0;
            }
            if (!bVar2) break;
            if (local_50 < 0x40) {
              *(char *)((long)local_10 + local_50 + 4) = *local_30;
            }
            local_30 = local_30 + 1;
            local_50 = local_50 + 1;
          }
          *(undefined1 *)((long)local_10 + 0x43) = 0;
          local_54 = 0;
          local_58 = 0;
          local_5c = 0;
          if (*local_30 == '_') {
            while( true ) {
              local_30 = local_30 + 1;
              iVar1 = isdigit((int)*local_30);
              if (iVar1 == 0) break;
              local_54 = *local_30 + -0x30 + local_54 * 10;
            }
            if (*local_30 == '.') {
              local_30 = local_30 + 1;
            }
            while (iVar1 = isdigit((int)*local_30), iVar1 != 0) {
              local_58 = *local_30 + -0x30 + local_58 * 10;
              local_30 = local_30 + 1;
            }
            if (*local_30 == '.') {
              local_30 = local_30 + 1;
            }
            while (iVar1 = isdigit((int)*local_30), iVar1 != 0) {
              local_5c = *local_30 + -0x30 + local_5c * 10;
              local_30 = local_30 + 1;
            }
          }
          *local_10 = local_54 << 0x16 | (local_58 & 0x3ff) << 0xc | local_5c & 0xfff;
          while( true ) {
            bVar2 = false;
            if (*local_30 != '\0') {
              iVar1 = isspace((int)*local_30);
              bVar2 = iVar1 == 0;
            }
            if (!bVar2) break;
            local_30 = local_30 + 1;
          }
          local_10 = local_10 + 0x11;
        }
      }
    }
  }
  if (local_20 != (long *)0x0) {
    *local_20 = (long)local_34 * 0x44;
  }
  return local_24;
}

Assistant:

static cl_int parseILString(
    const char* originalStr,
    cl_name_version_khr* ptr,
    size_t param_value_size,
    size_t* param_value_size_ret )
{
    cl_int  errorCode = CL_SUCCESS;

    // Go through the string once to count the number of tokens:
    const char* str = originalStr;
    int     numTokens = 0;
    while( str != NULL && str[0] != '\0' )
    {
        // Skip any preceding spaces
        while( isspace(str[0]) )
        {
            str++;
        }
        if( str[0] != '\0' )
        {
            // Find the next space, or end of string
            size_t  nameSize = 0;
            while( str[0] != '\0' && !isspace(str[0]) )
            {
                str++;
                nameSize++;
            }
            CLI_ASSERT( nameSize < CL_NAME_VERSION_MAX_NAME_SIZE_KHR );
            numTokens++;
        }
    }

    if( ptr != NULL )
    {
        if( param_value_size < numTokens * sizeof(cl_name_version_khr) )
        {
            errorCode = CL_INVALID_VALUE;
        }
        else
        {
            str = originalStr;
            while( str != NULL && str[0] != '\0' )
            {
                // skip any preceding spaces
                while( isspace(str[0]) )
                {
                    str++;
                }
                if( str[0] != '\0' )
                {
                    memset(ptr->name, 0, sizeof(ptr->name));

                    // find the next space, underscore, or end of string
                    size_t  nameSize = 0;
                    while( str[0] != '\0' && str[0] != '_' && !isspace(str[0]) )
                    {
                        if( nameSize < sizeof(ptr->name) )
                        {
                            ptr->name[nameSize] = str[0];
                        }
                        str++;
                        nameSize++;
                    }
                    ptr->name[sizeof(ptr->name) - 1] = '\0';

                    // version
                    cl_uint major = 0;
                    cl_uint minor = 0;
                    cl_uint patch = 0;
                    if( str[0] == '_' )
                    {
                        str++;
                        while( isdigit(str[0]) )
                        {
                            major *= 10;
                            major += str[0] - '0';
                            str++;
                        }
                        if( str[0] == '.' )
                        {
                            str++;
                        }
                        while( isdigit(str[0]) )
                        {
                            minor *= 10;
                            minor += str[0] - '0';
                            str++;
                        }
                        if( str[0] == '.' )
                        {
                            str++;
                        }
                        while( isdigit(str[0]) )
                        {
                            patch *= 10;
                            patch += str[0] - '0';
                            str++;
                        }
                    }
                    ptr->version = CL_MAKE_VERSION_KHR( major, minor, patch );

                    // find the next space or end of string
                    while( str[0] != '\0' && !isspace(str[0]) )
                    {
                        str++;
                    }

                    ptr++;
                }
            }
        }
    }
    if( param_value_size_ret != NULL )
    {
        *param_value_size_ret = numTokens * sizeof(cl_name_version_khr);
    }

    return errorCode;
}